

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxReturnStatement::Resolve(FxReturnStatement *this,FCompileContext *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  FxTypeCast *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PPrototype *proto;
  FCompileContext *size;
  TArray<PType_*,_PType_*> none;
  FxExpression *pFVar2;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Value == (FxExpression *)0x0) {
    TArray<PType_*,_PType_*>::TArray(&none,0);
    proto = NewPrototype(&none,&none);
    TArray<PType_*,_PType_*>::~TArray(&none);
  }
  else {
    size = ctx;
    iVar1 = (*this->Value->_vptr_FxExpression[2])();
    pFVar2 = (FxExpression *)CONCAT44(extraout_var,iVar1);
    this->Value = pFVar2;
    if (pFVar2 == (FxExpression *)0x0) {
LAB_00519bd1:
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      return (FxExpression *)0x0;
    }
    if (((ctx->ReturnProto != (PPrototype *)0x0) && ((ctx->ReturnProto->ReturnTypes).Count != 0)) &&
       (*(int *)&(ctx->Function->super_PSymbol).super_PTypeBase.super_DObject.field_0x24 != 0)) {
      this_00 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
      FxTypeCast::FxTypeCast(this_00,this->Value,*(ctx->ReturnProto->ReturnTypes).Array,false,false)
      ;
      this->Value = (FxExpression *)this_00;
      iVar1 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
      pFVar2 = (FxExpression *)CONCAT44(extraout_var_00,iVar1);
      this->Value = pFVar2;
      if (pFVar2 == (FxExpression *)0x0) goto LAB_00519bd1;
    }
    iVar1 = (*pFVar2->_vptr_FxExpression[5])(pFVar2);
    proto = (PPrototype *)CONCAT44(extraout_var_01,iVar1);
  }
  FCompileContext::CheckReturn(ctx,proto,&(this->super_FxExpression).ScriptPosition);
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxReturnStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE_OPT(Value, ctx);

	PPrototype *retproto;
	if (Value == nullptr)
	{
		TArray<PType *> none(0);
		retproto = NewPrototype(none, none);
	}
	else
	{
		// If we already know the real return type we need at least try to cast the value to its proper type (unless in an anonymous function.)
		if (ctx.ReturnProto != nullptr && ctx.ReturnProto->ReturnTypes.Size() > 0 && ctx.Function->SymbolName != NAME_None)
		{
			Value = new FxTypeCast(Value, ctx.ReturnProto->ReturnTypes[0], false, false);
			Value = Value->Resolve(ctx);
			ABORT(Value);
		}
		retproto = Value->ReturnProto();
	}

	ctx.CheckReturn(retproto, ScriptPosition);

	return this;
}